

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  FileDescriptor *pFVar5;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  FileOptions *this_00;
  undefined8 *puVar6;
  int i;
  int index;
  long lVar7;
  int i_1;
  long lVar8;
  
  uVar1 = *(undefined8 *)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar1,puVar6);
  lVar8 = *(long *)(this + 8);
  if (*(long *)(lVar8 + 8) != 0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar6 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
    internal::ArenaStringPtr::Set(&proto->package_,lVar8,puVar6);
  }
  if (this[0x3a] == (FileDescriptor)0x3) {
    pcVar4 = SyntaxName(SYNTAX_PROTO3);
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar6 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&proto->syntax_,pcVar4,puVar6);
  }
  for (index = 0; index < *(int *)(this + 0x20); index = index + 1) {
    pFVar5 = dependency(this,index);
    FileDescriptorProto::add_dependency(proto,*(string **)pFVar5);
  }
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x24); lVar8 = lVar8 + 1) {
    FileDescriptorProto::_internal_add_public_dependency
              (proto,*(int32_t *)(*(long *)(this + 0x48) + lVar8 * 4));
  }
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x28); lVar8 = lVar8 + 1) {
    FileDescriptorProto::_internal_add_weak_dependency
              (proto,*(int32_t *)(*(long *)(this + 0x50) + lVar8 * 4));
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x2c); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x58);
    proto_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&proto->message_type_);
    Descriptor::CopyTo((Descriptor *)(lVar3 + lVar7),proto_00);
    lVar7 = lVar7 + 0x88;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x30); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x60);
    proto_01 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&proto->enum_type_);
    EnumDescriptor::CopyTo((EnumDescriptor *)(lVar3 + lVar7),proto_01);
    lVar7 = lVar7 + 0x48;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x34); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x68);
    proto_02 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Add(&proto->service_);
    ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar3 + lVar7),proto_02);
    lVar7 = lVar7 + 0x30;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x3c); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x70);
    proto_03 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->extension_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar3 + lVar7),proto_03);
    lVar7 = lVar7 + 0x48;
  }
  if (*(undefined1 **)(this + 0x78) != _FileOptions_default_instance_) {
    this_00 = FileDescriptorProto::_internal_mutable_options(proto);
    FileOptions::CopyFrom(this_00,*(FileOptions **)(this + 0x78));
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}